

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

error_code
llvm::sys::fs::make_absolute
          (Twine *current_directory,SmallVectorImpl<char> *path,bool use_current_directory)

{
  StringRef path_00;
  Child CVar1;
  bool bVar2;
  uint uVar3;
  error_category *peVar4;
  ulong uVar5;
  ulong uVar6;
  error_code eVar7;
  StringRef SVar8;
  StringRef path_01;
  StringRef path_02;
  StringRef p;
  StringRef pRootName;
  SmallString<128U> current_dir;
  StringRef pRelativePath;
  StringRef bRelativePath;
  StringRef bRootDirectory;
  SmallString<128U> res;
  StringRef local_200;
  StringRef local_1f0;
  Twine local_1e0;
  Child local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  Twine local_1b8 [5];
  StringRef local_138;
  StringRef local_128;
  StringRef local_118;
  Twine local_108;
  Twine local_f0;
  Twine local_d8;
  SmallVectorImpl<char> local_c0;
  undefined1 local_b0 [128];
  
  local_200.Data =
       (char *)(path->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  local_200.Length =
       (size_t)(path->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  Twine::Twine((Twine *)&local_1c8,&local_200);
  bVar2 = sys::path::has_root_directory((Twine *)&local_1c8,native);
  if (bVar2) {
    uVar3 = 0;
    peVar4 = (error_category *)std::_V2::system_category();
    goto LAB_001595b0;
  }
  local_1c8.twine = local_1b8;
  local_1c0 = 0;
  uStack_1bc = 0x80;
  if (use_current_directory) {
    Twine::toVector(current_directory,(SmallVectorImpl<char> *)&local_1c8);
LAB_0015943d:
    SVar8.Length = local_200.Length;
    SVar8.Data = local_200.Data;
    local_1f0 = sys::path::root_name(SVar8,native);
    path_01.Length._0_4_ = local_1c0;
    path_01.Data = local_1c8.cString;
    path_01.Length._4_4_ = 0;
    local_118 = sys::path::root_directory(path_01,native);
    CVar1 = local_1c8;
    path_02.Length._0_4_ = local_1c0;
    path_02.Data = local_1c8.cString;
    uVar6 = (ulong)local_1c0;
    path_02.Length._4_4_ = 0;
    SVar8 = sys::path::root_path(path_02,native);
    local_138.Length = local_200.Length;
    local_138.Data = local_200.Data;
    uVar5 = SVar8.Length;
    if (uVar6 <= SVar8.Length) {
      uVar5 = uVar6;
    }
    local_128.Data = (char *)((long)&(CVar1.twine)->LHS + uVar5);
    local_128.Length = uVar6 - uVar5;
    path_00.Length = local_200.Length;
    path_00.Data = local_200.Data;
    SVar8 = sys::path::root_path(path_00,native);
    uVar5 = SVar8.Length;
    if (local_138.Length <= SVar8.Length) {
      uVar5 = local_138.Length;
    }
    local_138.Data = local_138.Data + uVar5;
    local_138.Length = local_138.Length - uVar5;
    local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = local_b0;
    local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x80;
    Twine::Twine(&local_1e0,&local_1f0);
    Twine::Twine(&local_d8,&local_118);
    Twine::Twine(&local_f0,&local_128);
    Twine::Twine(&local_108,&local_138);
    sys::path::append(&local_c0,native,&local_1e0,&local_d8,&local_f0,&local_108);
    SmallVectorImpl<char>::swap(path,&local_c0);
    peVar4 = (error_category *)std::_V2::system_category();
    if ((undefined1 *)
        local_c0.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_b0) {
      free(local_c0.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
    }
    uVar3 = 0;
  }
  else {
    eVar7 = current_path((SmallVectorImpl<char> *)&local_1c8);
    peVar4 = eVar7._M_cat;
    uVar3 = eVar7._M_value;
    if (uVar3 == 0) goto LAB_0015943d;
  }
  if (local_1c8.twine != local_1b8) {
    free(local_1c8.twine);
  }
LAB_001595b0:
  eVar7._4_4_ = 0;
  eVar7._M_value = uVar3;
  eVar7._M_cat = peVar4;
  return eVar7;
}

Assistant:

static std::error_code make_absolute(const Twine &current_directory,
                                     SmallVectorImpl<char> &path,
                                     bool use_current_directory) {
  StringRef p(path.data(), path.size());

  bool rootDirectory = path::has_root_directory(p);
  bool rootName =
      (real_style(Style::native) != Style::windows) || path::has_root_name(p);

  // Already absolute.
  if (rootName && rootDirectory)
    return std::error_code();

  // All of the following conditions will need the current directory.
  SmallString<128> current_dir;
  if (use_current_directory)
    current_directory.toVector(current_dir);
  else if (std::error_code ec = current_path(current_dir))
    return ec;

  // Relative path. Prepend the current directory.
  if (!rootName && !rootDirectory) {
    // Append path to the current directory.
    path::append(current_dir, p);
    // Set path to the result.
    path.swap(current_dir);
    return std::error_code();
  }

  if (!rootName && rootDirectory) {
    StringRef cdrn = path::root_name(current_dir);
    SmallString<128> curDirRootName(cdrn.begin(), cdrn.end());
    path::append(curDirRootName, p);
    // Set path to the result.
    path.swap(curDirRootName);
    return std::error_code();
  }

  if (rootName && !rootDirectory) {
    StringRef pRootName      = path::root_name(p);
    StringRef bRootDirectory = path::root_directory(current_dir);
    StringRef bRelativePath  = path::relative_path(current_dir);
    StringRef pRelativePath  = path::relative_path(p);

    SmallString<128> res;
    path::append(res, pRootName, bRootDirectory, bRelativePath, pRelativePath);
    path.swap(res);
    return std::error_code();
  }

  llvm_unreachable("All rootName and rootDirectory combinations should have "
                   "occurred above!");
}